

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_psx_Socket.h
# Opt level: O0

int __thiscall axl::io::psx::Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int __fd_00;
  bool bVar1;
  size_t sVar2;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  int result;
  
  __fd_00 = (this->super_File).super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
            m_h;
  sVar2 = getSockAddrSize((sockaddr *)0x14395d);
  ::bind(__fd_00,(sockaddr *)CONCAT44(in_register_00000034,__fd),(socklen_t)sVar2);
  bVar1 = err::complete(0);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool
	bind(const sockaddr* addr) {
		int result = ::bind(m_h, addr, getSockAddrSize(addr));
		return err::complete(result != -1);
	}